

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

void __thiscall Expr::GenCaseEval(Expr *this,Output *out_cc,Env *env)

{
  Expr *pEVar1;
  pointer pcVar2;
  long *plVar3;
  Type *pTVar4;
  ID *id;
  char *pcVar5;
  CaseExprList *pCVar6;
  char *__s;
  Exception *pEVar7;
  pointer ppCVar8;
  CaseExpr *pCVar9;
  CaseExpr *pCVar10;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pTVar4 = DataType(this,env);
  id = Env::AddTempID(env,pTVar4);
  if (pTVar4 == (Type *)0x0) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x20);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"undefined case value","");
    Exception::Exception(pEVar7,&this->super_Object,&local_50);
    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
  }
  (*(pTVar4->super_DataDepElement)._vptr_DataDepElement[0xb])(local_70,pTVar4);
  plVar3 = local_70[0];
  pcVar5 = Env::LValue(env,id);
  Output::println(out_cc,"%s %s;",plVar3,pcVar5);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  ForceIDEval(this->operand_[0],out_cc,env);
  pCVar6 = this->cases_;
  if (pCVar6 != (CaseExprList *)0x0) {
    for (ppCVar8 = (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar8 !=
        (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
      ForceIDEval((*ppCVar8)->value_,out_cc,env);
      pCVar6 = this->cases_;
    }
  }
  pEVar1 = this->operand_[0];
  GenEval(pEVar1,out_cc,env);
  pCVar9 = (CaseExpr *)0x0;
  Output::println(out_cc,"switch ( %s )",(pEVar1->str_)._M_dataplus._M_p);
  pTVar4 = DataType(this->operand_[0],env);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  pCVar6 = this->cases_;
  if (pCVar6 != (CaseExprList *)0x0) {
    ppCVar8 = (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppCVar8 ==
        (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar9 = (CaseExpr *)0x0;
    }
    else {
      pCVar10 = (CaseExpr *)0x0;
      do {
        pCVar9 = *ppCVar8;
        if (pCVar9->index_ == (ExprList *)0x0) {
          if (pCVar10 != (CaseExpr *)0x0) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x20);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"duplicate default cases","");
            Exception::Exception(pEVar7,&pCVar9->super_Object,&local_90);
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
        }
        else {
          GenCaseStr(pCVar9->index_,out_cc,env,pTVar4);
          out_cc->indent_ = out_cc->indent_ + 1;
          pcVar5 = Env::LValue(env,id);
          pEVar1 = pCVar9->value_;
          GenEval(pEVar1,out_cc,env);
          Output::println(out_cc,"%s = %s;",pcVar5,(pEVar1->str_)._M_dataplus._M_p);
          Output::println(out_cc,"break;");
          out_cc->indent_ = out_cc->indent_ + -1;
          pCVar6 = this->cases_;
          pCVar9 = pCVar10;
        }
        ppCVar8 = ppCVar8 + 1;
        pCVar10 = pCVar9;
      } while (ppCVar8 !=
               (pCVar6->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  GenCaseStr((ExprList *)0x0,out_cc,env,pTVar4);
  out_cc->indent_ = out_cc->indent_ + 1;
  if (pCVar9 == (CaseExpr *)0x0) {
    pcVar2 = (this->super_Object).location._M_dataplus._M_p;
    pEVar1 = this->operand_[0];
    GenEval(pEVar1,out_cc,env);
    Output::println(out_cc,"throw binpac::ExceptionInvalidCaseIndex(\"%s\", (int64)%s);",pcVar2,
                    (pEVar1->str_)._M_dataplus._M_p);
  }
  else {
    pcVar5 = Env::LValue(env,id);
    pEVar1 = pCVar9->value_;
    GenEval(pEVar1,out_cc,env);
    Output::println(out_cc,"%s = %s;",pcVar5,(pEVar1->str_)._M_dataplus._M_p);
  }
  Output::println(out_cc,"break;");
  out_cc->indent_ = out_cc->indent_ + -1;
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  Env::SetEvaluated(env,id,true);
  __s = Env::RValue(env,id);
  pcVar5 = (char *)(this->str_)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->str_,0,pcVar5,(ulong)__s);
  return;
}

Assistant:

void Expr::GenCaseEval(Output* out_cc, Env* env)
	{
	ASSERT(expr_type_ == EXPR_CASE);
	ASSERT(operand_[0]);
	ASSERT(cases_);

	Type* val_type = DataType(env);
	ID* val_var = env->AddTempID(val_type);

	// DataType(env) can return a null pointer if an enum value is not
	// defined.
	if ( ! val_type )
		throw Exception(this, "undefined case value");

	out_cc->println("%s %s;", val_type->DataTypeStr().c_str(), env->LValue(val_var));

	// force evaluation of IDs appearing in case stmt
	operand_[0]->ForceIDEval(out_cc, env);
	foreach (i, CaseExprList, cases_)
		(*i)->value()->ForceIDEval(out_cc, env);

	out_cc->println("switch ( %s )", operand_[0]->EvalExpr(out_cc, env));
	Type* switch_type = operand_[0]->DataType(env);

	out_cc->inc_indent();
	out_cc->println("{");

	CaseExpr* default_case = nullptr;
	foreach (i, CaseExprList, cases_)
		{
		CaseExpr* c = *i;
		ExprList* index = c->index();
		if ( ! index )
			{
			if ( default_case )
				throw Exception(c, "duplicate default cases");
			default_case = c;
			}
		else
			{
			GenCaseStr(index, out_cc, env, switch_type);
			out_cc->inc_indent();
			out_cc->println("%s = %s;", env->LValue(val_var), c->value()->EvalExpr(out_cc, env));
			out_cc->println("break;");
			out_cc->dec_indent();
			}
		}

	// Generate the default case after all other cases
	GenCaseStr(nullptr, out_cc, env, switch_type);
	out_cc->inc_indent();
	if ( default_case )
		{
		out_cc->println("%s = %s;", env->LValue(val_var),
		                default_case->value()->EvalExpr(out_cc, env));
		}
	else
		{
		out_cc->println("throw binpac::ExceptionInvalidCaseIndex(\"%s\", (int64)%s);", Location(),
		                operand_[0]->EvalExpr(out_cc, env));
		}
	out_cc->println("break;");
	out_cc->dec_indent();

	out_cc->println("}");
	out_cc->dec_indent();

	env->SetEvaluated(val_var);
	str_ = env->RValue(val_var);
	}